

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void Curl_expire_ex(Curl_easy *data,curltime *nowp,timediff_t milli,expire_id id)

{
  Curl_multi *pCVar1;
  uint uVar2;
  timediff_t tVar3;
  Curl_tree *pCVar4;
  curltime newer;
  curltime i;
  curltime older;
  int rc;
  timediff_t diff;
  curltime set;
  curltime *curr_expire;
  Curl_multi *multi;
  expire_id id_local;
  timediff_t milli_local;
  curltime *nowp_local;
  Curl_easy *data_local;
  
  pCVar1 = data->multi;
  set._8_8_ = &(data->state).expiretime;
  if (pCVar1 != (Curl_multi *)0x0) {
    set.tv_sec._0_4_ = (int)*(undefined8 *)&nowp->tv_usec;
    set.tv_sec._4_4_ = (undefined4)((ulong)*(undefined8 *)&nowp->tv_usec >> 0x20);
    diff = milli / 1000 + nowp->tv_sec;
    set.tv_sec._0_4_ = (int)(milli % 1000) * 1000 + (int)set.tv_sec;
    if (999999 < (int)set.tv_sec) {
      diff = diff + 1;
      set.tv_sec._0_4_ = (int)set.tv_sec + -1000000;
    }
    multi_deltimeout(data,id);
    multi_addtimeout(data,(curltime *)&diff,id);
    if ((*(long *)set._8_8_ != 0) || (*(int *)(set._8_8_ + 8) != 0)) {
      newer.tv_usec = (int)set.tv_sec;
      newer.tv_sec = diff;
      newer._12_4_ = 0;
      older._12_4_ = 0;
      older._0_12_ = *(undefined1 (*) [12])set._8_8_;
      tVar3 = Curl_timediff(newer,older);
      if (0 < tVar3) {
        return;
      }
      uVar2 = Curl_splayremove(pCVar1->timetree,&(data->state).timenode,&pCVar1->timetree);
      if ((((uVar2 != 0) && (data != (Curl_easy *)0x0)) &&
          ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,"Internal error removing splay node = %d",(ulong)uVar2);
      }
    }
    *(timediff_t *)set._8_8_ = diff;
    *(ulong *)(set._8_8_ + 8) = CONCAT44(set.tv_sec._4_4_,(int)set.tv_sec);
    Curl_splayset(&(data->state).timenode,data);
    i._12_4_ = 0;
    i._0_12_ = *(undefined1 (*) [12])set._8_8_;
    pCVar4 = Curl_splayinsert(i,pCVar1->timetree,&(data->state).timenode);
    pCVar1->timetree = pCVar4;
  }
  return;
}

Assistant:

static void Curl_expire_ex(struct Curl_easy *data,
                           const struct curltime *nowp,
                           timediff_t milli, expire_id id)
{
  struct Curl_multi *multi = data->multi;
  struct curltime *curr_expire = &data->state.expiretime;
  struct curltime set;

  /* this is only interesting while there is still an associated multi struct
     remaining! */
  if(!multi)
    return;

  DEBUGASSERT(id < EXPIRE_LAST);

  set = *nowp;
  set.tv_sec += (time_t)(milli/1000); /* might be a 64 to 32 bits conversion */
  set.tv_usec += (int)(milli%1000)*1000;

  if(set.tv_usec >= 1000000) {
    set.tv_sec++;
    set.tv_usec -= 1000000;
  }

  /* Remove any timer with the same id just in case. */
  multi_deltimeout(data, id);

  /* Add it to the timer list. It must stay in the list until it has expired
     in case we need to recompute the minimum timer later. */
  multi_addtimeout(data, &set, id);

  if(curr_expire->tv_sec || curr_expire->tv_usec) {
    /* This means that the struct is added as a node in the splay tree.
       Compare if the new time is earlier, and only remove-old/add-new if it
       is. */
    timediff_t diff = Curl_timediff(set, *curr_expire);
    int rc;

    if(diff > 0) {
      /* The current splay tree entry is sooner than this new expiry time.
         We do not need to update our splay tree entry. */
      return;
    }

    /* Since this is an updated time, we must remove the previous entry from
       the splay tree first and then re-add the new value */
    rc = Curl_splayremove(multi->timetree, &data->state.timenode,
                          &multi->timetree);
    if(rc)
      infof(data, "Internal error removing splay node = %d", rc);
  }

  /* Indicate that we are in the splay tree and insert the new timer expiry
     value since it is our local minimum. */
  *curr_expire = set;
  Curl_splayset(&data->state.timenode, data);
  multi->timetree = Curl_splayinsert(*curr_expire, multi->timetree,
                                     &data->state.timenode);
}